

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManUnivTfo(Gia_Man_t *p,int *pObjs,int nObjs,Vec_Int_t **pvNodes,Vec_Int_t **pvPos)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vPos;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar4 = pObjs;
  if (pvNodes != (Vec_Int_t **)0x0) {
    if (*pvNodes == (Vec_Int_t *)0x0) {
      pVVar2 = Vec_IntAlloc(100);
      *pvNodes = pVVar2;
    }
    else {
      (*pvNodes)->nSize = 0;
    }
  }
  if (pvPos != (Vec_Int_t **)0x0) {
    if (*pvPos == (Vec_Int_t *)0x0) {
      pVVar2 = Vec_IntAlloc(100);
      *pvPos = pVVar2;
    }
    else {
      (*pvPos)->nSize = 0;
    }
  }
  Gia_ManIncrementTravId(p);
  uVar5 = 0;
  uVar6 = (ulong)(uint)nObjs;
  if (nObjs < 1) {
    uVar6 = uVar5;
  }
  iVar3 = 0;
  for (; iVar1 = (int)piVar4, uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if (pvNodes == (Vec_Int_t **)0x0) {
      pVVar2 = (Vec_Int_t *)0x0;
    }
    else {
      pVVar2 = *pvNodes;
    }
    if (pvPos == (Vec_Int_t **)0x0) {
      vPos = (Vec_Int_t *)0x0;
    }
    else {
      vPos = *pvPos;
    }
    piVar4 = (int *)(ulong)(uint)pObjs[uVar5];
    iVar1 = Gia_ManUnivTfo_rec(p,pObjs[uVar5],pVVar2,vPos);
    iVar3 = iVar3 + iVar1;
  }
  if (pvNodes != (Vec_Int_t **)0x0) {
    Vec_IntSort(*pvNodes,iVar1);
  }
  if (pvPos != (Vec_Int_t **)0x0) {
    Vec_IntSort(*pvPos,iVar1);
  }
  return iVar3;
}

Assistant:

int Gia_ManUnivTfo( Gia_Man_t * p, int * pObjs, int nObjs, Vec_Int_t ** pvNodes, Vec_Int_t ** pvPos )
{
    int i, Count = 0;
    if ( pvNodes )
    {
        if ( *pvNodes )
            Vec_IntClear( *pvNodes );
        else
            *pvNodes = Vec_IntAlloc( 100 );
    }
    if ( pvPos )
    {
        if ( *pvPos )
            Vec_IntClear( *pvPos );
        else
            *pvPos = Vec_IntAlloc( 100 );
    }
    Gia_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        Count += Gia_ManUnivTfo_rec( p, pObjs[i], pvNodes ? *pvNodes : NULL, pvPos ? *pvPos : NULL );
    if ( pvNodes )
        Vec_IntSort( *pvNodes, 0 );
    if ( pvPos )
        Vec_IntSort( *pvPos, 0 );
    return Count;
}